

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_neg>(Mat *a,Option *opt)

{
  long *in_RDI;
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  __m128 afVar2;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_neg op;
  Mat *m;
  __m128 local_168;
  int local_154;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_138;
  long local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined8 local_110;
  float *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  unary_op_neg local_e1 [9];
  long *local_d8;
  undefined1 local_cd;
  int local_cc;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_a8;
  __m128 *local_a0;
  undefined8 local_98;
  float afStack_90 [4];
  __m128 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_28;
  
  local_e8 = *(int *)((long)in_RDI + 0x2c);
  local_ec = (int)in_RDI[6];
  local_f0 = *(int *)((long)in_RDI + 0x34);
  local_f4 = (int)in_RDI[7];
  local_f8 = (int)in_RDI[3];
  local_fc = local_e8 * local_ec * local_f0 * local_f8;
  local_d8 = in_RDI;
  for (local_100 = 0; local_100 < local_f4; local_100 = local_100 + 1) {
    local_c0 = &local_150;
    local_4c = *(int *)((long)local_d8 + 0x2c);
    local_50 = (int)local_d8[6];
    local_54 = *(undefined4 *)((long)local_d8 + 0x34);
    local_108 = (float *)(*local_d8 + local_d8[8] * (long)local_100 * local_d8[2]);
    local_68 = local_d8[2];
    local_6c = (undefined4)local_d8[3];
    local_78 = local_d8[4];
    local_48 = &local_150;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_b8 = &local_150;
    local_a8 = &local_150;
    local_3c = 0x10;
    local_cc = local_100;
    local_cd = 1;
    local_150 = 0;
    local_140 = 0;
    local_138 = 0;
    local_128 = 0;
    local_124 = 0;
    local_120 = 0;
    local_11c = 0;
    local_118 = 0;
    local_110 = 0;
    local_148 = 0;
    local_60 = local_108;
    local_28 = local_a8;
    local_130 = local_78;
    for (local_154 = 0; local_154 + 3 < local_fc; local_154 = local_154 + 4) {
      local_a0 = (__m128 *)local_108;
      local_168 = *(__m128 *)local_108;
      afVar2 = UnaryOp_x86_functor::unary_op_neg::func_pack4(local_e1,&local_168);
      local_98 = afVar2._0_8_;
      afVar2[2] = (float)extraout_XMM0_Dc;
      afVar2[0] = (float)(int)local_98;
      afVar2[1] = (float)(int)((ulong)local_98 >> 0x20);
      afVar2[3] = extraout_XMM0_Dd;
      local_80 = (__m128 *)local_108;
      local_168._8_8_ = afVar2._8_8_;
      afStack_90[0] = local_168[2];
      afStack_90[1] = local_168[3];
      *(undefined8 *)local_108 = local_98;
      *(undefined8 *)(local_108 + 2) = local_168._8_8_;
      local_108 = (float *)((long)local_108 + 0x10);
      local_168 = afVar2;
    }
    for (; local_154 < local_fc; local_154 = local_154 + 1) {
      fVar1 = UnaryOp_x86_functor::unary_op_neg::func(local_e1,local_108);
      *local_108 = fVar1;
      local_108 = local_108 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}